

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.hpp
# Opt level: O0

path * __thiscall boost::filesystem::path::assign<char*>(path *this,char *begin,char *end)

{
  undefined8 __end;
  char *from;
  long lVar1;
  long lVar2;
  allocator<char> local_41;
  string local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> seq;
  char *end_local;
  char *begin_local;
  path *this_local;
  
  seq.field_2._8_8_ = end;
  std::__cxx11::string::clear();
  __end = seq.field_2._8_8_;
  if (begin != (char *)seq.field_2._8_8_) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char*,void>(local_40,begin,(char *)__end,&local_41);
    std::allocator<char>::~allocator(&local_41);
    from = (char *)std::__cxx11::string::c_str();
    lVar1 = std::__cxx11::string::c_str();
    lVar2 = std::__cxx11::string::size();
    path_traits::convert(from,(char *)(lVar1 + lVar2),&this->m_pathname);
    std::__cxx11::string::~string(local_40);
  }
  return this;
}

Assistant:

path& assign(InputIterator begin, InputIterator end)
    {
      m_pathname.clear();
      if (begin != end)
      {
        std::basic_string<typename std::iterator_traits<InputIterator>::value_type>
          seq(begin, end);
        path_traits::convert(seq.c_str(), seq.c_str()+seq.size(), m_pathname);
      }
      return *this;
    }